

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTestsUtil.cpp
# Opt level: O0

void vkt::image::beginCommandBuffer(DeviceInterface *vk,VkCommandBuffer commandBuffer)

{
  VkResult result;
  undefined8 local_38;
  VkCommandBufferBeginInfo commandBufBeginParams;
  VkCommandBuffer commandBuffer_local;
  DeviceInterface *vk_local;
  
  local_38 = 0x2a;
  commandBufBeginParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  commandBufBeginParams._4_4_ = 0;
  commandBufBeginParams.pNext = (void *)0x0;
  commandBufBeginParams.flags = 0;
  commandBufBeginParams._20_4_ = 0;
  commandBufBeginParams.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)commandBuffer;
  result = (*vk->_vptr_DeviceInterface[0x49])(vk,commandBuffer,&local_38);
  ::vk::checkResult(result,"vk.beginCommandBuffer(commandBuffer, &commandBufBeginParams)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/image/vktImageTestsUtil.cpp"
                    ,0x17c);
  return;
}

Assistant:

void beginCommandBuffer (const DeviceInterface& vk, const VkCommandBuffer commandBuffer)
{
	const VkCommandBufferBeginInfo commandBufBeginParams =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		0u,												// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};
	VK_CHECK(vk.beginCommandBuffer(commandBuffer, &commandBufBeginParams));
}